

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::String::FormatIntWidth2_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [380];
  int local_14;
  string *psStack_10;
  int value_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(local_190,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,local_14);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatIntWidth2(int value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << value;
  return ss.str();
}